

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O3

MetadataResult SetUICommand(ShellState *state,char **azArg,idx_t nArg)

{
  MetadataResult MVar1;
  ulong uVar2;
  string command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (nArg == 0) {
    MVar1 = PRINT_USAGE;
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    if (nArg != 1) {
      uVar2 = 1;
      do {
        if (1 < uVar2) {
          std::__cxx11::string::append((char *)&local_70);
        }
        std::__cxx11::string::append((char *)&local_70);
        uVar2 = uVar2 + 1;
      } while (nArg != uVar2);
    }
    std::operator+(&local_50,"CALL ",&local_70);
    std::__cxx11::string::operator=((string *)&state->ui_command,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    MVar1 = SUCCESS;
  }
  return MVar1;
}

Assistant:

MetadataResult SetUICommand(ShellState &state, const char **azArg, idx_t nArg) {
	if (nArg < 1) {
		return MetadataResult::PRINT_USAGE;
	}
	string command;
	for (idx_t i = 1; i < nArg; i++) {
		if (i > 1) {
			command += " ";
		}
		command += azArg[i];
	}
	state.ui_command = "CALL " + command;
	return MetadataResult::SUCCESS;
}